

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uv-common.c
# Opt level: O2

void uv_free_cpu_info(uv_cpu_info_t *cpu_infos,int count)

{
  ulong uVar1;
  ulong uVar2;
  
  uVar2 = 0;
  uVar1 = (ulong)(uint)count;
  if (count < 1) {
    uVar1 = uVar2;
  }
  for (; uVar1 * 0x38 - uVar2 != 0; uVar2 = uVar2 + 0x38) {
    uv__free(*(void **)((long)&cpu_infos->model + uVar2));
  }
  uv__free(cpu_infos);
  return;
}

Assistant:

void uv_free_cpu_info(uv_cpu_info_t* cpu_infos, int count) {
  int i;

  for (i = 0; i < count; i++)
    uv__free(cpu_infos[i].model);

  uv__free(cpu_infos);
}